

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O1

void Msat_IntVecSort(Msat_IntVec_t *p,int fReverse)

{
  code *__compar;
  
  __compar = Msat_IntVecSortCompare2;
  if (fReverse == 0) {
    __compar = Msat_IntVecSortCompare1;
  }
  qsort(p->pArray,(long)p->nSize,4,__compar);
  return;
}

Assistant:

void Msat_IntVecSort( Msat_IntVec_t * p, int fReverse )
{
    if ( fReverse ) 
        qsort( (void *)p->pArray, (size_t)p->nSize, sizeof(int), 
                (int (*)(const void *, const void *)) Msat_IntVecSortCompare2 );
    else
        qsort( (void *)p->pArray, (size_t)p->nSize, sizeof(int), 
                (int (*)(const void *, const void *)) Msat_IntVecSortCompare1 );
}